

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_SetStreamFinishedCallback
                  (PaStream *stream,PaStreamFinishedCallback *streamFinishedCallback)

{
  int iVar1;
  int iVar2;
  
  if (initializationCount_ != 0) {
    iVar1 = -0x2704;
    if ((stream != (PaStream *)0x0) && (*stream == 0x18273645)) {
      iVar2 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
      iVar1 = -0x26fe;
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
      if (iVar1 == 1) {
        *(PaStreamFinishedCallback **)((long)stream + 0x20) = streamFinishedCallback;
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  return -10000;
}

Assistant:

PaError Pa_SetStreamFinishedCallback( PaStream *stream, PaStreamFinishedCallback* streamFinishedCallback )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_SetStreamFinishedCallback" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tPaStreamFinishedCallback* streamFinishedCallback: 0x%p\n", streamFinishedCallback ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = paStreamIsNotStopped ;
        }
        if( result == 1 )
        {
            PA_STREAM_REP( stream )->streamFinishedCallback = streamFinishedCallback;
            result = paNoError;
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_SetStreamFinishedCallback", result );

    return result;

}